

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_mnist.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  MakeNet *pMVar2;
  ostream *poVar3;
  __off_t __length;
  allocator local_479;
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  rng;
  PlainTextNetworkWriter local_470;
  IntClassifier metrics;
  IterationCallback local_450;
  _Vector_base<int,_std::allocator<int>_> local_428;
  string local_410;
  string local_3f0;
  LabeledDataset mnist;
  code *local_388 [2];
  code *local_378;
  code *local_370;
  string local_368;
  Net net;
  LabeledDataset mnistMiniTest;
  OneHotEncoder onehot;
  LabeledDataset mnistTest;
  ofstream nnfile;
  undefined4 uStack_224;
  _Any_data local_220;
  pointer pMStack_210;
  pointer pMStack_208;
  
  std::__cxx11::string::string((string *)&local_368,(string *)&LABELS_FILE_abi_cxx11_);
  readMNIST(&mnist,&IMAGES_FILE_abi_cxx11_,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::string((string *)&local_3f0,(string *)&LABELS_TEST_FILE_abi_cxx11_);
  readMNIST(&mnistTest,&IMAGES_TEST_FILE_abi_cxx11_,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string((string *)&local_410,(string *)&LABELS_TEST_FILE_abi_cxx11_);
  readMNIST(&mnistMiniTest,&IMAGES_TEST_FILE_abi_cxx11_,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  local_428._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_428._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  notch::pre::OneHotEncoder::OneHotEncoder
            (&onehot,&mnist.outputs,(vector<int,_std::allocator<int>_> *)&local_428);
  notch::core::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_428);
  notch::core::LabeledDataset::applyToLabels(&mnist,&onehot.super_ADatasetTransformer);
  notch::core::LabeledDataset::applyToLabels(&mnistTest,&onehot.super_ADatasetTransformer);
  notch::core::LabeledDataset::applyToLabels(&mnistMiniTest,&onehot.super_ADatasetTransformer);
  notch::core::Init::newRNG();
  notch::core::LabeledDataset::shuffle(&mnistMiniTest,&rng);
  notch::core::LabeledDataset::truncate(&mnistMiniTest,(char *)0x3e8,__length);
  notch::core::MakeNet::MakeNet((MakeNet *)&nnfile,mnist.inputDimension);
  pMVar2 = notch::core::MakeNet::addFC((MakeNet *)&nnfile,300,(Activation *)notch::core::scaledTanh)
  ;
  pMVar2 = notch::core::MakeNet::addFC(pMVar2,100,(Activation *)notch::core::leakyReLU);
  pMVar2 = notch::core::MakeNet::addFC
                     (pMVar2,mnist.outputDimension,(Activation *)notch::core::scaledTanh);
  pMVar2 = notch::core::MakeNet::addSoftmax(pMVar2);
  local_388[1] = (code *)0x0;
  local_388[0] = notch::core::Init::normalXavier;
  local_370 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_invoke;
  local_378 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_manager;
  notch::core::MakeNet::init((MakeNet *)&net,(EVP_PKEY_CTX *)pMVar2);
  notch::core::std::_Function_base::~_Function_base((_Function_base *)local_388);
  notch::core::MakeNet::~MakeNet((MakeNet *)&nnfile);
  metrics.super_AClassifier<int,_1>._vptr_AClassifier = (_func_int **)&PTR_aslabel_0012ebf8;
  _nnfile = &PTR_update_0012ec48;
  local_220._M_unused._M_object = (void *)0x358637bd3f733333;
  local_220._8_8_ = (pointer)0x0;
  pMStack_210 = (pointer)0x0;
  metrics.enc = &onehot;
  metrics.net = &net;
  notch::core::Net::setLearningPolicy(&net,(ALearningPolicy *)&nnfile);
  _nnfile = (undefined **)CONCAT44(uStack_224,1);
  local_220._M_unused._M_object = (void *)0x0;
  local_220._8_8_ = (pointer)0x0;
  pMStack_210 = (pointer)0x0;
  pMStack_208 = (pointer)0x0;
  local_220._M_unused._M_object = operator_new(0x18);
  *(MakeNet **)local_220._M_unused._0_8_ = (MakeNet *)&net;
  *(LabeledDataset **)((long)local_220._M_unused._0_8_ + 8) = &mnistTest;
  *(IntClassifier **)((long)local_220._M_unused._0_8_ + 0x10) = &metrics;
  pMStack_208 = (pointer)notch::core::std::
                         _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_mnist.cpp:126:35)>
                         ::_M_invoke;
  pMStack_210 = (pointer)notch::core::std::
                         _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_mnist.cpp:126:35)>
                         ::_M_manager;
  local_450.period = 1000;
  local_450.callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_450.callback.super__Function_base._M_functor._8_8_ = 0;
  local_450.callback.super__Function_base._M_manager = (_Manager_type)0x0;
  local_450.callback._M_invoker = (_Invoker_type)0x0;
  local_450.callback.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  *(MakeNet **)local_450.callback.super__Function_base._M_functor._M_unused._0_8_ = (MakeNet *)&net;
  *(LabeledDataset **)((long)local_450.callback.super__Function_base._M_functor._M_unused._0_8_ + 8)
       = &mnistMiniTest;
  *(IntClassifier **)
   ((long)local_450.callback.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = &metrics;
  local_450.callback._M_invoker =
       notch::core::std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_mnist.cpp:131:42)>
       ::_M_invoke;
  local_450.callback.super__Function_base._M_manager =
       notch::core::std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_mnist.cpp:131:42)>
       ::_M_manager;
  notch::core::SGD::train(&net,&mnist,3,(EpochCallback *)&nnfile,&local_450);
  notch::core::std::_Function_base::~_Function_base(&local_450.callback.super__Function_base);
  notch::core::std::_Function_base::~_Function_base((_Function_base *)&local_220);
  std::ofstream::ofstream(&nnfile,(string *)&SAVE_NETWORK_SNAPSHOT_abi_cxx11_,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_470.out = (ostream *)&nnfile;
    notch::io::PlainTextNetworkWriter::save(&local_470,&net);
    std::__cxx11::string::string((string *)&local_450,"\n",&local_479);
    std::operator<<(local_470.out,(string *)&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    poVar3 = std::operator<<((ostream *)&std::cout,"wrote ");
    poVar3 = std::operator<<(poVar3,(string *)&SAVE_NETWORK_SNAPSHOT_abi_cxx11_);
    std::operator<<(poVar3,"\n");
  }
  std::ofstream::~ofstream(&nnfile);
  notch::core::Net::~Net(&net);
  notch::core::std::
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  ::~unique_ptr(&rng);
  notch::pre::OneHotEncoder::~OneHotEncoder(&onehot);
  notch::core::LabeledDataset::~LabeledDataset(&mnistMiniTest);
  notch::core::LabeledDataset::~LabeledDataset(&mnistTest);
  notch::core::LabeledDataset::~LabeledDataset(&mnist);
  return 0;
}

Assistant:

int main() {
    LabeledDataset mnist = readMNIST(IMAGES_FILE, LABELS_FILE);
    LabeledDataset mnistTest = readMNIST(IMAGES_TEST_FILE, LABELS_TEST_FILE);
    LabeledDataset mnistMiniTest = readMNIST(IMAGES_TEST_FILE, LABELS_TEST_FILE);

    OneHotEncoder onehot(mnist.getLabels());
    mnist.applyToLabels(onehot);
    mnistTest.applyToLabels(onehot);
    mnistMiniTest.applyToLabels(onehot);

    // test on a small dataset while running
    unique_ptr<RNG> rng = Init::newRNG();
    mnistMiniTest.shuffle(rng);
    mnistMiniTest.truncate(1000);

    Net net = MakeNet(mnist.inputDim())
        .addFC(300, scaledTanh)
        .addFC(100, leakyReLU)
        .addFC(mnist.outputDim(), scaledTanh)
        .addSoftmax()
        .init();

    IntClassifier metrics(net, onehot);
    net.setLearningPolicy(AdaDelta());
    SGD::train(net, mnist, 3 /* epochs */,
               EpochCallback { 1, [&](int i) {
                   cout << "epoch " << i << ": ";
                   printStats(net, mnistTest, metrics);
                   return false;
               }},
               IterationCallback { 1000, [&](int i) {
                   cout << "sample " << i << ": ";
                   printStats(net, mnistMiniTest, metrics);
                   return false;
               }});

    ofstream nnfile(SAVE_NETWORK_SNAPSHOT);
    if (nnfile.is_open()) {
        PlainTextNetworkWriter(nnfile) << net << "\n";
        cout << "wrote " << SAVE_NETWORK_SNAPSHOT << "\n";
    }
}